

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unitary_tests_utils.h
# Opt level: O0

void GUDHI_TEST_FLOAT_EQUALITY_CHECK<float>(float a,float b,float epsilon)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  double dVar3;
  basic_cstring<const_char> local_a0 [2];
  basic_cstring<const_char> local_80;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_70;
  assertion_result local_50;
  basic_cstring<const_char> local_38;
  basic_cstring<const_char> local_28;
  float local_14;
  float local_10;
  float epsilon_local;
  float b_local;
  float a_local;
  
  local_14 = epsilon;
  local_10 = b;
  epsilon_local = a;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/common/include/gudhi/Unitary_tests_utils.h"
               ,0x74);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_38);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_28,0x1a,&local_38);
    dVar3 = std::fabs((double)(ulong)(uint)(epsilon_local - local_10));
    boost::test_tools::assertion_result::assertion_result(&local_50,SUB84(dVar3,0) <= local_14);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_80,"std::fabs(a - b) <= epsilon",0x1b);
    boost::unit_test::operator<<(&local_70,prev,&local_80);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/common/include/gudhi/Unitary_tests_utils.h"
               ,0x74);
    boost::test_tools::tt_detail::report_assertion(&local_50,&local_70,local_a0,0x1a,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_70);
    boost::test_tools::assertion_result::~assertion_result(&local_50);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

void GUDHI_TEST_FLOAT_EQUALITY_CHECK(FloatingType a, FloatingType b,
                                     FloatingType epsilon = std::numeric_limits<FloatingType>::epsilon()) {
#ifdef DEBUG_TRACES
  std::clog << "GUDHI_TEST_FLOAT_EQUALITY_CHECK - " << a << " versus " << b
            << " | diff = " << std::fabs(a - b) << " - epsilon = " << epsilon << std::endl;
#endif
  BOOST_CHECK(std::fabs(a - b) <= epsilon);
}